

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O2

BoxList * __thiscall amrex::BoxList::enclosedCells(BoxList *this,int dir)

{
  int *piVar1;
  pointer pBVar2;
  byte bVar3;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *__range1;
  pointer pBVar4;
  
  pBVar2 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar3 = (byte)dir & 0x1f;
  for (pBVar4 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start; pBVar4 != pBVar2; pBVar4 = pBVar4 + 1) {
    if (((pBVar4->btype).itype & 1 << ((byte)dir & 0x1f)) != 0) {
      piVar1 = (pBVar4->bigend).vect + dir;
      *piVar1 = *piVar1 + -1;
      (pBVar4->btype).itype = (pBVar4->btype).itype & (-2 << bVar3 | 0xfffffffeU >> 0x20 - bVar3);
    }
  }
  return this;
}

Assistant:

BoxList&
BoxList::enclosedCells (int dir) noexcept
{
    for (auto& bx : m_lbox)
    {
        bx.enclosedCells(dir);
    }
    return *this;
}